

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTransform.cpp
# Opt level: O3

void __thiscall
xmrig::BaseTransform::transformUint64(BaseTransform *this,Document *doc,int key,uint64_t arg)

{
  Type pGVar1;
  char *name;
  Ch *pCVar2;
  undefined1 local_38 [8];
  StringRefType local_30;
  
  if (key < 0x3ef) {
    if (key == 0x52) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,(Ch *)doc);
      if (local_38 ==
          (undefined1  [8])
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.length * 0x20 +
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.str & 0xffffffffffff))) {
        local_30.s = "retry-pause";
        local_30.length = 0xb;
        goto LAB_00144627;
      }
      name = "retry-pause";
    }
    else if (key == 0x72) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,(Ch *)doc);
      if (local_38 ==
          (undefined1  [8])
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.length * 0x20 +
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.str & 0xffffffffffff))) {
        local_30.s = "retries";
        local_30.length = 7;
        goto LAB_00144627;
      }
      name = "retries";
    }
    else {
      if (key != 0x3eb) {
        return;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,(Ch *)doc);
      if (local_38 ==
          (undefined1  [8])
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.length * 0x20 +
          ((ulong)(doc->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.str & 0xffffffffffff))) {
        local_30.s = "donate-level";
        local_30.length = 0xc;
LAB_00144627:
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  (&doc->
                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ,&local_30,arg,doc->allocator_);
        return;
      }
      name = "donate-level";
    }
  }
  else {
    if (key != 0x3ef) {
      if (key == 0x3fb) {
        add<unsigned_long>(this,doc,"pools","daemon-poll-interval",arg,false);
        return;
      }
      if (key != 0x1004) {
        return;
      }
      this->m_http = true;
      set<unsigned_long>(this,doc,"http","port",arg);
      return;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_38,(Ch *)doc);
    if (local_38 ==
        (undefined1  [8])
        ((ulong)(doc->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ).data_.s.length * 0x20 +
        ((ulong)(doc->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ).data_.s.str & 0xffffffffffff))) {
      local_30.s = "print-time";
      local_30.length = 10;
      goto LAB_00144627;
    }
    name = "print-time";
  }
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)doc,name);
  pCVar2 = (Ch *)((ulong)((arg & 0xffffffff80000000) == 0) << 0x35 | 0x1d6000000000000);
  if (arg >> 0x20 != 0) {
    pCVar2 = (Ch *)(~arg >> 8 & 0x80000000000000 | 0x116000000000000);
  }
  (pGVar1->data_).n = (Number)arg;
  (pGVar1->data_).s.str = pCVar2;
  return;
}

Assistant:

void xmrig::BaseTransform::transformUint64(rapidjson::Document &doc, int key, uint64_t arg)
{
    switch (key) {
    case IConfig::RetriesKey: /* --retries */
        return set(doc, "retries", arg);

    case IConfig::RetryPauseKey: /* --retry-pause */
        return set(doc, "retry-pause", arg);

    case IConfig::DonateLevelKey: /* --donate-level */
        return set(doc, "donate-level", arg);

    case IConfig::HttpPort: /* --http-port */
        m_http = true;
        return set(doc, kHttp, "port", arg);

    case IConfig::PrintTimeKey: /* --print-time */
        return set(doc, "print-time", arg);

#   ifdef XMRIG_FEATURE_HTTP
    case IConfig::DaemonPollKey:  /* --daemon-poll-interval */
        return add(doc, kPools, "daemon-poll-interval", arg);
#   endif

    default:
        break;
    }
}